

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O3

bool dxil_spv::emit_wave_bit_count_instruction
               (GroupOperation operation,Impl *impl,CallInst *instruction)

{
  Id IVar1;
  Builder *this;
  Operation *this_00;
  Value *value;
  Operation *this_01;
  Capability local_2c;
  
  this = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar1 = spv::Builder::makeVectorType(this,IVar1,4);
  this_00 = Converter::Impl::allocate(impl,OpGroupNonUniformBallot,IVar1);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar1 = spv::Builder::makeIntConstant(this,IVar1,3,false);
  Operation::add_id(this_00,IVar1);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar1 = Converter::Impl::get_id_for_value(impl,value,0);
  if (((impl->execution_model == ExecutionModelFragment) &&
      ((impl->options).strict_helper_lane_waveops == true)) &&
     (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
    IVar1 = build_masked_ballot(impl,IVar1);
  }
  Operation::add_id(this_00,IVar1);
  Converter::Impl::add(impl,this_00,false);
  this_01 = Converter::Impl::allocate(impl,OpGroupNonUniformBallotBitCount,(Value *)instruction);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar1 = spv::Builder::makeIntConstant(this,IVar1,3,false);
  Operation::add_id(this_01,IVar1);
  Operation::add_literal(this_01,operation);
  Operation::add_id(this_01,this_00->id);
  local_2c = CapabilityGroupNonUniformBallot;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this->capabilities,&local_2c);
  Converter::Impl::add(impl,this_01,false);
  return true;
}

Assistant:

bool emit_wave_bit_count_instruction(spv::GroupOperation operation, Converter::Impl &impl,
                                     const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	auto *ballot_op = impl.allocate(spv::OpGroupNonUniformBallot, builder.makeVectorType(builder.makeUintType(32), 4));
	ballot_op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));

	spv::Id bool_value = impl.get_id_for_value(instruction->getOperand(1));
	if (wave_op_needs_helper_lane_masking(impl))
		bool_value = build_masked_ballot(impl, bool_value);
	ballot_op->add_id(bool_value);

	impl.add(ballot_op);

	auto *op = impl.allocate(spv::OpGroupNonUniformBallotBitCount, instruction);
	op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	op->add_literal(operation);
	op->add_id(ballot_op->id);

	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	impl.add(op);
	return true;
}